

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  ushort uVar1;
  ushort uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  undefined4 uVar39;
  ulong unaff_R14;
  size_t mask;
  ulong uVar40;
  bool bVar41;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar42;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar46 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined4 uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  float fVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar124 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar139 [32];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar149 [32];
  float fVar154;
  undefined1 auVar153 [32];
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined1 local_ea9;
  ulong *local_ea8;
  ulong local_ea0;
  ulong local_e98;
  ulong local_e90;
  ulong local_e88;
  size_t local_e80;
  RayK<8> *local_e78;
  uint local_e70;
  uint local_e6c;
  ulong local_e68;
  undefined1 local_e60 [32];
  undefined1 local_e30 [16];
  undefined1 local_e20 [16];
  float local_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  ulong local_df8;
  ulong local_df0;
  ulong local_de8;
  ulong local_de0;
  ulong local_dd8;
  ulong local_dd0;
  ulong local_dc8;
  ulong local_dc0;
  ulong local_db8;
  ulong local_db0;
  long local_da8;
  long local_da0;
  Scene *local_d98;
  long local_d90;
  ulong *local_d88;
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  float local_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float local_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float local_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  RTCFilterFunctionNArguments local_cb0;
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  float local_940 [4];
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_ea8 = local_7f8;
  local_800 = root.ptr;
  uVar39 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_cc0._4_4_ = uVar39;
  local_cc0._0_4_ = uVar39;
  local_cc0._8_4_ = uVar39;
  local_cc0._12_4_ = uVar39;
  auVar120 = ZEXT1664(local_cc0);
  uVar39 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_cd0._4_4_ = uVar39;
  local_cd0._0_4_ = uVar39;
  local_cd0._8_4_ = uVar39;
  local_cd0._12_4_ = uVar39;
  auVar124 = ZEXT1664(local_cd0);
  uVar39 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_ce0._4_4_ = uVar39;
  local_ce0._0_4_ = uVar39;
  local_ce0._8_4_ = uVar39;
  local_ce0._12_4_ = uVar39;
  auVar132 = ZEXT1664(local_ce0);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar52 = fVar56 * 0.99999964;
  fVar53 = fVar70 * 0.99999964;
  fVar54 = fVar42 * 0.99999964;
  fVar56 = fVar56 * 1.0000004;
  fVar70 = fVar70 * 1.0000004;
  fVar42 = fVar42 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar36 = uVar29 ^ 0x10;
  uVar40 = uVar33 ^ 0x10;
  uVar37 = uVar35 ^ 0x10;
  iVar26 = (tray->tnear).field_0.i[k];
  local_e20._4_4_ = iVar26;
  local_e20._0_4_ = iVar26;
  local_e20._8_4_ = iVar26;
  local_e20._12_4_ = iVar26;
  auVar104 = ZEXT1664(local_e20);
  iVar26 = (tray->tfar).field_0.i[k];
  local_e30._4_4_ = iVar26;
  local_e30._0_4_ = iVar26;
  local_e30._8_4_ = iVar26;
  local_e30._12_4_ = iVar26;
  auVar112 = ZEXT1664(local_e30);
  local_dc0 = uVar29 >> 2;
  local_b80._16_16_ = mm_lookupmask_ps._240_16_;
  local_b80._0_16_ = mm_lookupmask_ps._0_16_;
  local_dc8 = uVar36 >> 2;
  iVar26 = 1 << ((uint)k & 0x1f);
  local_dd0 = uVar33 >> 2;
  local_dd8 = uVar40 >> 2;
  local_de0 = uVar35 >> 2;
  local_de8 = uVar37 >> 2;
  auVar47._4_4_ = iVar26;
  auVar47._0_4_ = iVar26;
  auVar47._8_4_ = iVar26;
  auVar47._12_4_ = iVar26;
  auVar47._16_4_ = iVar26;
  auVar47._20_4_ = iVar26;
  auVar47._24_4_ = iVar26;
  auVar47._28_4_ = iVar26;
  auVar48 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar47 = vpand_avx2(auVar47,auVar48);
  local_be0 = vpcmpeqd_avx2(auVar47,auVar48);
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = &DAT_3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar62._16_4_ = 0x3f800000;
  auVar62._20_4_ = 0x3f800000;
  auVar62._24_4_ = 0x3f800000;
  auVar62._28_4_ = 0x3f800000;
  auVar48._8_4_ = 0xbf800000;
  auVar48._0_8_ = 0xbf800000bf800000;
  auVar48._12_4_ = 0xbf800000;
  auVar48._16_4_ = 0xbf800000;
  auVar48._20_4_ = 0xbf800000;
  auVar48._24_4_ = 0xbf800000;
  auVar48._28_4_ = 0xbf800000;
  _local_ba0 = vblendvps_avx(auVar62,auVar48,local_b80);
  fVar55 = fVar42;
  fVar121 = fVar42;
  fVar57 = fVar42;
  fVar58 = fVar52;
  fVar65 = fVar52;
  fVar66 = fVar52;
  fVar67 = fVar53;
  fVar68 = fVar53;
  fVar69 = fVar53;
  fVar140 = fVar54;
  fVar142 = fVar54;
  fVar144 = fVar54;
  fVar150 = fVar56;
  fVar151 = fVar56;
  fVar152 = fVar56;
  fVar154 = fVar70;
  fVar125 = fVar70;
  fVar126 = fVar70;
  local_ea0 = uVar36;
  local_e98 = uVar35;
  local_e90 = uVar33;
  local_e88 = uVar29;
  local_e80 = k;
  local_e78 = ray;
  local_e10 = fVar42;
  fStack_e0c = fVar42;
  fStack_e08 = fVar42;
  fStack_e04 = fVar42;
  local_d30 = fVar70;
  fStack_d2c = fVar70;
  fStack_d28 = fVar70;
  fStack_d24 = fVar70;
  local_d20 = fVar56;
  fStack_d1c = fVar56;
  fStack_d18 = fVar56;
  fStack_d14 = fVar56;
  local_d10 = fVar54;
  fStack_d0c = fVar54;
  fStack_d08 = fVar54;
  fStack_d04 = fVar54;
  local_d00 = fVar53;
  fStack_cfc = fVar53;
  fStack_cf8 = fVar53;
  fStack_cf4 = fVar53;
  local_cf0 = fVar52;
  fStack_cec = fVar52;
  fStack_ce8 = fVar52;
  fStack_ce4 = fVar52;
  do {
    local_d88 = local_ea8;
    if (local_ea8 == &local_800) break;
    uVar31 = local_ea8[-1];
    local_ea8 = local_ea8 + -1;
    do {
      if ((uVar31 & 8) == 0) {
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar29),auVar120._0_16_);
        auVar43._0_4_ = fVar52 * auVar46._0_4_;
        auVar43._4_4_ = fVar58 * auVar46._4_4_;
        auVar43._8_4_ = fVar65 * auVar46._8_4_;
        auVar43._12_4_ = fVar66 * auVar46._12_4_;
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar33),auVar124._0_16_);
        auVar59._0_4_ = fVar53 * auVar46._0_4_;
        auVar59._4_4_ = fVar67 * auVar46._4_4_;
        auVar59._8_4_ = fVar68 * auVar46._8_4_;
        auVar59._12_4_ = fVar69 * auVar46._12_4_;
        auVar46 = vmaxps_avx(auVar43,auVar59);
        auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar35),auVar132._0_16_);
        auVar60._0_4_ = fVar54 * auVar43._0_4_;
        auVar60._4_4_ = fVar140 * auVar43._4_4_;
        auVar60._8_4_ = fVar142 * auVar43._8_4_;
        auVar60._12_4_ = fVar144 * auVar43._12_4_;
        auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar36),auVar120._0_16_);
        auVar71._0_4_ = fVar56 * auVar43._0_4_;
        auVar71._4_4_ = fVar150 * auVar43._4_4_;
        auVar71._8_4_ = fVar151 * auVar43._8_4_;
        auVar71._12_4_ = fVar152 * auVar43._12_4_;
        auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar40),auVar124._0_16_);
        auVar82._0_4_ = fVar70 * auVar43._0_4_;
        auVar82._4_4_ = fVar154 * auVar43._4_4_;
        auVar82._8_4_ = fVar125 * auVar43._8_4_;
        auVar82._12_4_ = fVar126 * auVar43._12_4_;
        auVar59 = vminps_avx(auVar71,auVar82);
        auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar37),auVar132._0_16_);
        auVar83._0_4_ = fVar42 * auVar43._0_4_;
        auVar83._4_4_ = fVar55 * auVar43._4_4_;
        auVar83._8_4_ = fVar121 * auVar43._8_4_;
        auVar83._12_4_ = fVar57 * auVar43._12_4_;
        auVar43 = vmaxps_avx(auVar60,auVar104._0_16_);
        auVar46 = vmaxps_avx(auVar46,auVar43);
        auVar43 = vminps_avx(auVar83,auVar112._0_16_);
        auVar43 = vminps_avx(auVar59,auVar43);
        auVar46 = vcmpps_avx(auVar46,auVar43,2);
        uVar39 = vmovmskps_avx(auVar46);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar39);
      }
      if ((uVar31 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar27 = 4;
        }
        else {
          uVar30 = uVar31 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar31 = unaff_R14; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          uVar27 = 0;
          for (uVar32 = unaff_R14 - 1 & unaff_R14; uVar31 = *(ulong *)(uVar30 + lVar28 * 8),
              uVar32 != 0; uVar32 = uVar32 - 1 & uVar32) {
            *local_ea8 = uVar31;
            local_ea8 = local_ea8 + 1;
            lVar28 = 0;
            for (uVar31 = uVar32; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
          }
        }
      }
      else {
        uVar27 = 6;
      }
    } while (uVar27 == 0);
    if (uVar27 == 6) {
      local_df0 = (ulong)((uint)uVar31 & 0xf) - 8;
      bVar41 = local_df0 != 0;
      if (bVar41) {
        uVar31 = uVar31 & 0xfffffffffffffff0;
        local_db0 = 0;
        do {
          lVar28 = local_db0 * 0x58;
          local_d90 = uVar31 + lVar28;
          uVar39 = *(undefined4 *)(uVar31 + 0x38 + lVar28);
          auVar72._4_4_ = uVar39;
          auVar72._0_4_ = uVar39;
          auVar72._8_4_ = uVar39;
          auVar72._12_4_ = uVar39;
          uVar39 = *(undefined4 *)(uVar31 + 0x44 + lVar28);
          auVar84._4_4_ = uVar39;
          auVar84._0_4_ = uVar39;
          auVar84._8_4_ = uVar39;
          auVar84._12_4_ = uVar39;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(local_dc0 + 0x20 + local_d90);
          auVar46 = vpmovzxbd_avx(auVar46);
          auVar46 = vcvtdq2ps_avx(auVar46);
          auVar43 = vfmadd213ps_fma(auVar46,auVar84,auVar72);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(local_dc8 + 0x20 + local_d90);
          auVar46 = vpmovzxbd_avx(auVar44);
          auVar46 = vcvtdq2ps_avx(auVar46);
          auVar59 = vfmadd213ps_fma(auVar46,auVar84,auVar72);
          uVar39 = *(undefined4 *)(uVar31 + 0x3c + lVar28);
          auVar73._4_4_ = uVar39;
          auVar73._0_4_ = uVar39;
          auVar73._8_4_ = uVar39;
          auVar73._12_4_ = uVar39;
          uVar39 = *(undefined4 *)(uVar31 + 0x48 + lVar28);
          auVar85._4_4_ = uVar39;
          auVar85._0_4_ = uVar39;
          auVar85._8_4_ = uVar39;
          auVar85._12_4_ = uVar39;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(local_dd0 + 0x20 + local_d90);
          auVar46 = vpmovzxbd_avx(auVar96);
          auVar46 = vcvtdq2ps_avx(auVar46);
          auVar71 = vfmadd213ps_fma(auVar46,auVar85,auVar73);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = *(ulong *)(local_dd8 + 0x20 + local_d90);
          auVar46 = vpmovzxbd_avx(auVar102);
          auVar46 = vcvtdq2ps_avx(auVar46);
          auVar82 = vfmadd213ps_fma(auVar46,auVar85,auVar73);
          uVar39 = *(undefined4 *)(uVar31 + 0x40 + lVar28);
          auVar74._4_4_ = uVar39;
          auVar74._0_4_ = uVar39;
          auVar74._8_4_ = uVar39;
          auVar74._12_4_ = uVar39;
          uVar39 = *(undefined4 *)(uVar31 + 0x4c + lVar28);
          auVar86._4_4_ = uVar39;
          auVar86._0_4_ = uVar39;
          auVar86._8_4_ = uVar39;
          auVar86._12_4_ = uVar39;
          auVar105._8_8_ = 0;
          auVar105._0_8_ = *(ulong *)(local_de0 + 0x20 + local_d90);
          auVar46 = vpmovzxbd_avx(auVar105);
          auVar46 = vcvtdq2ps_avx(auVar46);
          auVar83 = vfmadd213ps_fma(auVar46,auVar86,auVar74);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = *(ulong *)(local_de8 + 0x20 + local_d90);
          auVar46 = vpmovzxbd_avx(auVar113);
          auVar46 = vcvtdq2ps_avx(auVar46);
          auVar44 = vfmadd213ps_fma(auVar46,auVar86,auVar74);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *(ulong *)(uVar31 + 0x20 + lVar28);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)(uVar31 + 0x24 + lVar28);
          auVar46 = vpminub_avx(auVar75,auVar87);
          auVar60 = vpcmpeqb_avx(auVar75,auVar46);
          auVar46 = vsubps_avx(auVar43,auVar120._0_16_);
          auVar61._0_4_ = fVar52 * auVar46._0_4_;
          auVar61._4_4_ = fVar58 * auVar46._4_4_;
          auVar61._8_4_ = fVar65 * auVar46._8_4_;
          auVar61._12_4_ = fVar66 * auVar46._12_4_;
          auVar46 = vsubps_avx(auVar71,auVar124._0_16_);
          auVar88._0_4_ = fVar53 * auVar46._0_4_;
          auVar88._4_4_ = fVar67 * auVar46._4_4_;
          auVar88._8_4_ = fVar68 * auVar46._8_4_;
          auVar88._12_4_ = fVar69 * auVar46._12_4_;
          auVar46 = vmaxps_avx(auVar61,auVar88);
          auVar43 = vsubps_avx(auVar59,auVar120._0_16_);
          auVar45._0_4_ = fVar56 * auVar43._0_4_;
          auVar45._4_4_ = fVar150 * auVar43._4_4_;
          auVar45._8_4_ = fVar151 * auVar43._8_4_;
          auVar45._12_4_ = fVar152 * auVar43._12_4_;
          auVar43 = vsubps_avx(auVar82,auVar124._0_16_);
          auVar89._0_4_ = fVar70 * auVar43._0_4_;
          auVar89._4_4_ = fVar154 * auVar43._4_4_;
          auVar89._8_4_ = fVar125 * auVar43._8_4_;
          auVar89._12_4_ = fVar126 * auVar43._12_4_;
          auVar59 = vminps_avx(auVar45,auVar89);
          auVar43 = vsubps_avx(auVar83,auVar132._0_16_);
          auVar90._0_4_ = fVar54 * auVar43._0_4_;
          auVar90._4_4_ = fVar140 * auVar43._4_4_;
          auVar90._8_4_ = fVar142 * auVar43._8_4_;
          auVar90._12_4_ = fVar144 * auVar43._12_4_;
          auVar43 = vmaxps_avx(auVar90,local_e20);
          auVar46 = vmaxps_avx(auVar46,auVar43);
          auVar43 = vsubps_avx(auVar44,auVar132._0_16_);
          auVar91._0_4_ = local_e10 * auVar43._0_4_;
          auVar91._4_4_ = fStack_e0c * auVar43._4_4_;
          auVar91._8_4_ = fStack_e08 * auVar43._8_4_;
          auVar91._12_4_ = fStack_e04 * auVar43._12_4_;
          auVar43 = vminps_avx(auVar91,local_e30);
          auVar43 = vminps_avx(auVar59,auVar43);
          auVar46 = vcmpps_avx(auVar46,auVar43,2);
          auVar43 = vpmovzxbd_avx(auVar60 ^ _DAT_01febe20);
          auVar46 = vpandn_avx(auVar43,auVar46);
          auVar46 = vpslld_avx(auVar46,0x1f);
          uVar27 = vmovmskps_avx(auVar46);
          if (uVar27 != 0) {
            local_db8 = (ulong)(uVar27 & 0xff);
            do {
              lVar28 = 0;
              for (uVar29 = local_db8; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000)
              {
                lVar28 = lVar28 + 1;
              }
              uVar1 = *(ushort *)(local_d90 + lVar28 * 8);
              uVar2 = *(ushort *)(local_d90 + 2 + lVar28 * 8);
              local_c20._4_4_ = *(uint *)(local_d90 + 0x50);
              local_e68 = (ulong)local_c20._4_4_;
              local_c40._4_4_ = *(uint *)(local_d90 + 4 + lVar28 * 8);
              local_df8 = (ulong)local_c40._4_4_;
              local_d98 = context->scene;
              pGVar3 = (local_d98->geometries).items[local_e68].ptr;
              local_da0 = *(long *)&pGVar3->field_0x58;
              local_da8 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i * local_df8;
              local_e6c = uVar1 & 0x7fff;
              local_e70 = uVar2 & 0x7fff;
              uVar27 = *(uint *)(local_da0 + 4 + local_da8);
              uVar35 = (ulong)uVar27;
              uVar33 = (ulong)(uVar27 * local_e70 + *(int *)(local_da0 + local_da8) + local_e6c);
              lVar28 = *(long *)&pGVar3[1].time_range.upper;
              p_Var4 = pGVar3[1].intersectionFilterN;
              auVar46 = *(undefined1 (*) [16])(lVar28 + (uVar33 + 1) * (long)p_Var4);
              auVar43 = *(undefined1 (*) [16])(lVar28 + (uVar33 + uVar35) * (long)p_Var4);
              lVar38 = uVar33 + uVar35 + 1;
              auVar59 = *(undefined1 (*) [16])(lVar28 + lVar38 * (long)p_Var4);
              auVar60 = *(undefined1 (*) [16])
                         (lVar28 + (uVar33 + (-1 < (short)uVar1) + 1) * (long)p_Var4);
              lVar34 = (ulong)(-1 < (short)uVar1) + lVar38;
              auVar71 = *(undefined1 (*) [16])(lVar28 + lVar34 * (long)p_Var4);
              uVar29 = 0;
              if (-1 < (short)uVar2) {
                uVar29 = uVar35;
              }
              auVar82 = *(undefined1 (*) [16])(lVar28 + (uVar33 + uVar35 + uVar29) * (long)p_Var4);
              auVar83 = *(undefined1 (*) [16])(lVar28 + (lVar38 + uVar29) * (long)p_Var4);
              auVar116._16_16_ = *(undefined1 (*) [16])(lVar28 + (uVar29 + lVar34) * (long)p_Var4);
              auVar116._0_16_ = auVar59;
              auVar45 = vunpcklps_avx(auVar46,auVar71);
              auVar44 = vunpckhps_avx(auVar46,auVar71);
              auVar61 = vunpcklps_avx(auVar60,auVar59);
              auVar60 = vunpckhps_avx(auVar60,auVar59);
              auVar72 = vunpcklps_avx(auVar44,auVar60);
              auVar73 = vunpcklps_avx(auVar45,auVar61);
              auVar60 = vunpckhps_avx(auVar45,auVar61);
              auVar45 = vunpcklps_avx(auVar43,auVar83);
              auVar44 = vunpckhps_avx(auVar43,auVar83);
              auVar61 = vunpcklps_avx(auVar59,auVar82);
              auVar82 = vunpckhps_avx(auVar59,auVar82);
              auVar44 = vunpcklps_avx(auVar44,auVar82);
              auVar74 = vunpcklps_avx(auVar45,auVar61);
              auVar82 = vunpckhps_avx(auVar45,auVar61);
              auVar76._16_16_ = auVar83;
              auVar76._0_16_ = auVar43;
              auVar63._16_16_ = auVar71;
              auVar63._0_16_ = auVar46;
              auVar47 = vunpcklps_avx(auVar63,auVar76);
              auVar49._16_16_ = auVar59;
              auVar49._0_16_ = *(undefined1 (*) [16])(lVar28 + (long)p_Var4 * uVar33);
              auVar48 = vunpcklps_avx(auVar49,auVar116);
              auVar80 = vunpcklps_avx(auVar48,auVar47);
              auVar47 = vunpckhps_avx(auVar48,auVar47);
              auVar48 = vunpckhps_avx(auVar63,auVar76);
              auVar62 = vunpckhps_avx(auVar49,auVar116);
              auVar48 = vunpcklps_avx(auVar62,auVar48);
              auVar153._16_16_ = auVar73;
              auVar153._0_16_ = auVar73;
              auVar77._16_16_ = auVar60;
              auVar77._0_16_ = auVar60;
              auVar98._16_16_ = auVar72;
              auVar98._0_16_ = auVar72;
              auVar117._16_16_ = auVar74;
              auVar117._0_16_ = auVar74;
              auVar122._16_16_ = auVar82;
              auVar122._0_16_ = auVar82;
              uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4);
              auVar131._4_4_ = uVar39;
              auVar131._0_4_ = uVar39;
              auVar131._8_4_ = uVar39;
              auVar131._12_4_ = uVar39;
              auVar131._16_4_ = uVar39;
              auVar131._20_4_ = uVar39;
              auVar131._24_4_ = uVar39;
              auVar131._28_4_ = uVar39;
              uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x20);
              auVar133._4_4_ = uVar39;
              auVar133._0_4_ = uVar39;
              auVar133._8_4_ = uVar39;
              auVar133._12_4_ = uVar39;
              auVar133._16_4_ = uVar39;
              auVar133._20_4_ = uVar39;
              auVar133._24_4_ = uVar39;
              auVar133._28_4_ = uVar39;
              auVar106._16_16_ = auVar44;
              auVar106._0_16_ = auVar44;
              uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x40);
              auVar139._4_4_ = uVar39;
              auVar139._0_4_ = uVar39;
              auVar139._8_4_ = uVar39;
              auVar139._12_4_ = uVar39;
              auVar139._16_4_ = uVar39;
              auVar139._20_4_ = uVar39;
              auVar139._24_4_ = uVar39;
              auVar139._28_4_ = uVar39;
              local_d60 = vsubps_avx(auVar80,auVar131);
              auVar80 = vsubps_avx(auVar47,auVar133);
              auVar47 = vsubps_avx(auVar48,auVar139);
              auVar48 = vsubps_avx(auVar153,auVar131);
              auVar62 = vsubps_avx(auVar77,auVar133);
              auVar111 = vsubps_avx(auVar98,auVar139);
              auVar49 = vsubps_avx(auVar117,auVar131);
              auVar63 = vsubps_avx(auVar122,auVar133);
              auVar5 = vsubps_avx(auVar106,auVar139);
              auVar76 = vsubps_avx(auVar49,local_d60);
              auVar77 = vsubps_avx(auVar63,auVar80);
              local_aa0 = vsubps_avx(auVar5,auVar47);
              auVar50._0_4_ = auVar49._0_4_ + local_d60._0_4_;
              auVar50._4_4_ = auVar49._4_4_ + local_d60._4_4_;
              auVar50._8_4_ = auVar49._8_4_ + local_d60._8_4_;
              auVar50._12_4_ = auVar49._12_4_ + local_d60._12_4_;
              auVar50._16_4_ = auVar49._16_4_ + local_d60._16_4_;
              auVar50._20_4_ = auVar49._20_4_ + local_d60._20_4_;
              auVar50._24_4_ = auVar49._24_4_ + local_d60._24_4_;
              auVar50._28_4_ = auVar49._28_4_ + local_d60._28_4_;
              auVar78._0_4_ = auVar80._0_4_ + auVar63._0_4_;
              auVar78._4_4_ = auVar80._4_4_ + auVar63._4_4_;
              auVar78._8_4_ = auVar80._8_4_ + auVar63._8_4_;
              auVar78._12_4_ = auVar80._12_4_ + auVar63._12_4_;
              auVar78._16_4_ = auVar80._16_4_ + auVar63._16_4_;
              auVar78._20_4_ = auVar80._20_4_ + auVar63._20_4_;
              auVar78._24_4_ = auVar80._24_4_ + auVar63._24_4_;
              auVar78._28_4_ = auVar80._28_4_ + auVar63._28_4_;
              fVar56 = auVar47._0_4_;
              auVar107._0_4_ = auVar5._0_4_ + fVar56;
              fVar70 = auVar47._4_4_;
              auVar107._4_4_ = auVar5._4_4_ + fVar70;
              fVar42 = auVar47._8_4_;
              auVar107._8_4_ = auVar5._8_4_ + fVar42;
              fVar52 = auVar47._12_4_;
              auVar107._12_4_ = auVar5._12_4_ + fVar52;
              fVar53 = auVar47._16_4_;
              auVar107._16_4_ = auVar5._16_4_ + fVar53;
              fVar54 = auVar47._20_4_;
              auVar107._20_4_ = auVar5._20_4_ + fVar54;
              fVar55 = auVar47._24_4_;
              auVar107._24_4_ = auVar5._24_4_ + fVar55;
              auVar107._28_4_ = auVar5._28_4_ + auVar47._28_4_;
              auVar6._4_4_ = local_aa0._4_4_ * auVar78._4_4_;
              auVar6._0_4_ = local_aa0._0_4_ * auVar78._0_4_;
              auVar6._8_4_ = local_aa0._8_4_ * auVar78._8_4_;
              auVar6._12_4_ = local_aa0._12_4_ * auVar78._12_4_;
              auVar6._16_4_ = local_aa0._16_4_ * auVar78._16_4_;
              auVar6._20_4_ = local_aa0._20_4_ * auVar78._20_4_;
              auVar6._24_4_ = local_aa0._24_4_ * auVar78._24_4_;
              auVar6._28_4_ = uVar39;
              auVar43 = vfmsub231ps_fma(auVar6,auVar77,auVar107);
              auVar7._4_4_ = auVar76._4_4_ * auVar107._4_4_;
              auVar7._0_4_ = auVar76._0_4_ * auVar107._0_4_;
              auVar7._8_4_ = auVar76._8_4_ * auVar107._8_4_;
              auVar7._12_4_ = auVar76._12_4_ * auVar107._12_4_;
              auVar7._16_4_ = auVar76._16_4_ * auVar107._16_4_;
              auVar7._20_4_ = auVar76._20_4_ * auVar107._20_4_;
              auVar7._24_4_ = auVar76._24_4_ * auVar107._24_4_;
              auVar7._28_4_ = auVar107._28_4_;
              auVar46 = vfmsub231ps_fma(auVar7,local_aa0,auVar50);
              auVar8._4_4_ = auVar77._4_4_ * auVar50._4_4_;
              auVar8._0_4_ = auVar77._0_4_ * auVar50._0_4_;
              auVar8._8_4_ = auVar77._8_4_ * auVar50._8_4_;
              auVar8._12_4_ = auVar77._12_4_ * auVar50._12_4_;
              auVar8._16_4_ = auVar77._16_4_ * auVar50._16_4_;
              auVar8._20_4_ = auVar77._20_4_ * auVar50._20_4_;
              auVar8._24_4_ = auVar77._24_4_ * auVar50._24_4_;
              auVar8._28_4_ = auVar50._28_4_;
              auVar59 = vfmsub231ps_fma(auVar8,auVar76,auVar78);
              uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0xa0);
              local_e60._4_4_ = uVar39;
              local_e60._0_4_ = uVar39;
              local_e60._8_4_ = uVar39;
              local_e60._12_4_ = uVar39;
              local_e60._16_4_ = uVar39;
              local_e60._20_4_ = uVar39;
              local_e60._24_4_ = uVar39;
              local_e60._28_4_ = uVar39;
              local_ac0 = *(float *)(local_e78 + local_e80 * 4 + 0xc0);
              auVar9._4_4_ = local_ac0 * auVar59._4_4_;
              auVar9._0_4_ = local_ac0 * auVar59._0_4_;
              auVar9._8_4_ = local_ac0 * auVar59._8_4_;
              auVar9._12_4_ = local_ac0 * auVar59._12_4_;
              auVar9._16_4_ = local_ac0 * 0.0;
              auVar9._20_4_ = local_ac0 * 0.0;
              auVar9._24_4_ = local_ac0 * 0.0;
              auVar9._28_4_ = auVar78._28_4_;
              auVar46 = vfmadd231ps_fma(auVar9,local_e60,ZEXT1632(auVar46));
              uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x80);
              local_d80._4_4_ = uVar39;
              local_d80._0_4_ = uVar39;
              local_d80._8_4_ = uVar39;
              local_d80._12_4_ = uVar39;
              local_d80._16_4_ = uVar39;
              local_d80._20_4_ = uVar39;
              local_d80._24_4_ = uVar39;
              local_d80._28_4_ = uVar39;
              auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),local_d80,ZEXT1632(auVar43));
              local_ae0 = vsubps_avx(auVar80,auVar62);
              local_b00 = vsubps_avx(auVar47,auVar111);
              auVar149._0_4_ = auVar80._0_4_ + auVar62._0_4_;
              auVar149._4_4_ = auVar80._4_4_ + auVar62._4_4_;
              auVar149._8_4_ = auVar80._8_4_ + auVar62._8_4_;
              auVar149._12_4_ = auVar80._12_4_ + auVar62._12_4_;
              auVar149._16_4_ = auVar80._16_4_ + auVar62._16_4_;
              auVar149._20_4_ = auVar80._20_4_ + auVar62._20_4_;
              auVar149._24_4_ = auVar80._24_4_ + auVar62._24_4_;
              auVar149._28_4_ = auVar80._28_4_ + auVar62._28_4_;
              auVar108._0_4_ = fVar56 + auVar111._0_4_;
              auVar108._4_4_ = fVar70 + auVar111._4_4_;
              auVar108._8_4_ = fVar42 + auVar111._8_4_;
              auVar108._12_4_ = fVar52 + auVar111._12_4_;
              auVar108._16_4_ = fVar53 + auVar111._16_4_;
              auVar108._20_4_ = fVar54 + auVar111._20_4_;
              auVar108._24_4_ = fVar55 + auVar111._24_4_;
              fVar121 = auVar111._28_4_;
              auVar108._28_4_ = auVar47._28_4_ + fVar121;
              fVar57 = local_b00._0_4_;
              fVar65 = local_b00._4_4_;
              auVar10._4_4_ = auVar149._4_4_ * fVar65;
              auVar10._0_4_ = auVar149._0_4_ * fVar57;
              fVar67 = local_b00._8_4_;
              auVar10._8_4_ = auVar149._8_4_ * fVar67;
              fVar69 = local_b00._12_4_;
              auVar10._12_4_ = auVar149._12_4_ * fVar69;
              fVar142 = local_b00._16_4_;
              auVar10._16_4_ = auVar149._16_4_ * fVar142;
              fVar150 = local_b00._20_4_;
              auVar10._20_4_ = auVar149._20_4_ * fVar150;
              fVar152 = local_b00._24_4_;
              auVar10._24_4_ = auVar149._24_4_ * fVar152;
              auVar10._28_4_ = auVar76._28_4_;
              auVar59 = vfmsub231ps_fma(auVar10,local_ae0,auVar108);
              local_b20 = vsubps_avx(local_d60,auVar48);
              fVar58 = local_b20._0_4_;
              fVar66 = local_b20._4_4_;
              auVar11._4_4_ = auVar108._4_4_ * fVar66;
              auVar11._0_4_ = auVar108._0_4_ * fVar58;
              fVar68 = local_b20._8_4_;
              auVar11._8_4_ = auVar108._8_4_ * fVar68;
              fVar140 = local_b20._12_4_;
              auVar11._12_4_ = auVar108._12_4_ * fVar140;
              fVar144 = local_b20._16_4_;
              auVar11._16_4_ = auVar108._16_4_ * fVar144;
              fVar151 = local_b20._20_4_;
              auVar11._20_4_ = auVar108._20_4_ * fVar151;
              fVar154 = local_b20._24_4_;
              auVar11._24_4_ = auVar108._24_4_ * fVar154;
              auVar11._28_4_ = local_aa0._28_4_;
              auVar109._0_4_ = local_d60._0_4_ + auVar48._0_4_;
              auVar109._4_4_ = local_d60._4_4_ + auVar48._4_4_;
              auVar109._8_4_ = local_d60._8_4_ + auVar48._8_4_;
              auVar109._12_4_ = local_d60._12_4_ + auVar48._12_4_;
              auVar109._16_4_ = local_d60._16_4_ + auVar48._16_4_;
              auVar109._20_4_ = local_d60._20_4_ + auVar48._20_4_;
              auVar109._24_4_ = local_d60._24_4_ + auVar48._24_4_;
              auVar109._28_4_ = local_d60._28_4_ + auVar48._28_4_;
              auVar43 = vfmsub231ps_fma(auVar11,local_b00,auVar109);
              fVar138 = local_ae0._0_4_;
              fVar141 = local_ae0._4_4_;
              auVar12._4_4_ = fVar141 * auVar109._4_4_;
              auVar12._0_4_ = fVar138 * auVar109._0_4_;
              fVar143 = local_ae0._8_4_;
              auVar12._8_4_ = fVar143 * auVar109._8_4_;
              fVar145 = local_ae0._12_4_;
              auVar12._12_4_ = fVar145 * auVar109._12_4_;
              fVar146 = local_ae0._16_4_;
              auVar12._16_4_ = fVar146 * auVar109._16_4_;
              fVar147 = local_ae0._20_4_;
              auVar12._20_4_ = fVar147 * auVar109._20_4_;
              fVar148 = local_ae0._24_4_;
              auVar12._24_4_ = fVar148 * auVar109._24_4_;
              auVar12._28_4_ = auVar109._28_4_;
              auVar60 = vfmsub231ps_fma(auVar12,local_b20,auVar149);
              auVar110._0_4_ = local_ac0 * auVar60._0_4_;
              auVar110._4_4_ = local_ac0 * auVar60._4_4_;
              auVar110._8_4_ = local_ac0 * auVar60._8_4_;
              auVar110._12_4_ = local_ac0 * auVar60._12_4_;
              auVar110._16_4_ = local_ac0 * 0.0;
              auVar110._20_4_ = local_ac0 * 0.0;
              auVar110._24_4_ = local_ac0 * 0.0;
              auVar110._28_4_ = 0;
              auVar43 = vfmadd231ps_fma(auVar110,local_e60,ZEXT1632(auVar43));
              auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),local_d80,ZEXT1632(auVar59));
              auVar6 = vsubps_avx(auVar48,auVar49);
              auVar99._0_4_ = auVar48._0_4_ + auVar49._0_4_;
              auVar99._4_4_ = auVar48._4_4_ + auVar49._4_4_;
              auVar99._8_4_ = auVar48._8_4_ + auVar49._8_4_;
              auVar99._12_4_ = auVar48._12_4_ + auVar49._12_4_;
              auVar99._16_4_ = auVar48._16_4_ + auVar49._16_4_;
              auVar99._20_4_ = auVar48._20_4_ + auVar49._20_4_;
              auVar99._24_4_ = auVar48._24_4_ + auVar49._24_4_;
              auVar99._28_4_ = auVar48._28_4_ + auVar49._28_4_;
              auVar49 = vsubps_avx(auVar62,auVar63);
              auVar114._0_4_ = auVar62._0_4_ + auVar63._0_4_;
              auVar114._4_4_ = auVar62._4_4_ + auVar63._4_4_;
              auVar114._8_4_ = auVar62._8_4_ + auVar63._8_4_;
              auVar114._12_4_ = auVar62._12_4_ + auVar63._12_4_;
              auVar114._16_4_ = auVar62._16_4_ + auVar63._16_4_;
              auVar114._20_4_ = auVar62._20_4_ + auVar63._20_4_;
              auVar114._24_4_ = auVar62._24_4_ + auVar63._24_4_;
              auVar114._28_4_ = auVar62._28_4_ + auVar63._28_4_;
              auVar63 = vsubps_avx(auVar111,auVar5);
              auVar92._0_4_ = auVar111._0_4_ + auVar5._0_4_;
              auVar92._4_4_ = auVar111._4_4_ + auVar5._4_4_;
              auVar92._8_4_ = auVar111._8_4_ + auVar5._8_4_;
              auVar92._12_4_ = auVar111._12_4_ + auVar5._12_4_;
              auVar92._16_4_ = auVar111._16_4_ + auVar5._16_4_;
              auVar92._20_4_ = auVar111._20_4_ + auVar5._20_4_;
              auVar92._24_4_ = auVar111._24_4_ + auVar5._24_4_;
              auVar92._28_4_ = fVar121 + auVar5._28_4_;
              auVar111._4_4_ = auVar114._4_4_ * auVar63._4_4_;
              auVar111._0_4_ = auVar114._0_4_ * auVar63._0_4_;
              auVar111._8_4_ = auVar114._8_4_ * auVar63._8_4_;
              auVar111._12_4_ = auVar114._12_4_ * auVar63._12_4_;
              auVar111._16_4_ = auVar114._16_4_ * auVar63._16_4_;
              auVar111._20_4_ = auVar114._20_4_ * auVar63._20_4_;
              auVar111._24_4_ = auVar114._24_4_ * auVar63._24_4_;
              auVar111._28_4_ = fVar121;
              auVar60 = vfmsub231ps_fma(auVar111,auVar49,auVar92);
              auVar5._4_4_ = auVar92._4_4_ * auVar6._4_4_;
              auVar5._0_4_ = auVar92._0_4_ * auVar6._0_4_;
              auVar5._8_4_ = auVar92._8_4_ * auVar6._8_4_;
              auVar5._12_4_ = auVar92._12_4_ * auVar6._12_4_;
              auVar5._16_4_ = auVar92._16_4_ * auVar6._16_4_;
              auVar5._20_4_ = auVar92._20_4_ * auVar6._20_4_;
              auVar5._24_4_ = auVar92._24_4_ * auVar6._24_4_;
              auVar5._28_4_ = auVar92._28_4_;
              auVar59 = vfmsub231ps_fma(auVar5,auVar63,auVar99);
              auVar13._4_4_ = auVar99._4_4_ * auVar49._4_4_;
              auVar13._0_4_ = auVar99._0_4_ * auVar49._0_4_;
              auVar13._8_4_ = auVar99._8_4_ * auVar49._8_4_;
              auVar13._12_4_ = auVar99._12_4_ * auVar49._12_4_;
              auVar13._16_4_ = auVar99._16_4_ * auVar49._16_4_;
              auVar13._20_4_ = auVar99._20_4_ * auVar49._20_4_;
              auVar13._24_4_ = auVar99._24_4_ * auVar49._24_4_;
              auVar13._28_4_ = auVar99._28_4_;
              auVar71 = vfmsub231ps_fma(auVar13,auVar6,auVar114);
              auVar100._0_4_ = local_ac0 * auVar71._0_4_;
              auVar100._4_4_ = local_ac0 * auVar71._4_4_;
              auVar100._8_4_ = local_ac0 * auVar71._8_4_;
              auVar100._12_4_ = local_ac0 * auVar71._12_4_;
              auVar100._16_4_ = local_ac0 * 0.0;
              auVar100._20_4_ = local_ac0 * 0.0;
              auVar100._24_4_ = local_ac0 * 0.0;
              auVar100._28_4_ = 0;
              auVar59 = vfmadd231ps_fma(auVar100,local_e60,ZEXT1632(auVar59));
              auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),local_d80,ZEXT1632(auVar60));
              fVar134 = auVar59._0_4_ + auVar46._0_4_ + auVar43._0_4_;
              fVar135 = auVar59._4_4_ + auVar46._4_4_ + auVar43._4_4_;
              fVar136 = auVar59._8_4_ + auVar46._8_4_ + auVar43._8_4_;
              fVar137 = auVar59._12_4_ + auVar46._12_4_ + auVar43._12_4_;
              local_c60 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar136,CONCAT44(fVar135,fVar134))));
              auVar93._8_4_ = 0x7fffffff;
              auVar93._0_8_ = 0x7fffffff7fffffff;
              auVar93._12_4_ = 0x7fffffff;
              auVar93._16_4_ = 0x7fffffff;
              auVar93._20_4_ = 0x7fffffff;
              auVar93._24_4_ = 0x7fffffff;
              auVar93._28_4_ = 0x7fffffff;
              local_b60 = ZEXT1632(auVar46);
              auVar47 = vminps_avx(local_b60,ZEXT1632(auVar43));
              auVar47 = vminps_avx(auVar47,ZEXT1632(auVar59));
              local_bc0 = vandps_avx(local_c60,auVar93);
              fVar121 = local_bc0._0_4_ * 1.1920929e-07;
              fVar125 = local_bc0._4_4_ * 1.1920929e-07;
              auVar14._4_4_ = fVar125;
              auVar14._0_4_ = fVar121;
              fVar126 = local_bc0._8_4_ * 1.1920929e-07;
              auVar14._8_4_ = fVar126;
              fVar127 = local_bc0._12_4_ * 1.1920929e-07;
              auVar14._12_4_ = fVar127;
              fVar128 = local_bc0._16_4_ * 1.1920929e-07;
              auVar14._16_4_ = fVar128;
              fVar129 = local_bc0._20_4_ * 1.1920929e-07;
              auVar14._20_4_ = fVar129;
              fVar130 = local_bc0._24_4_ * 1.1920929e-07;
              auVar14._24_4_ = fVar130;
              auVar14._28_4_ = 0x34000000;
              auVar118._0_8_ = CONCAT44(fVar125,fVar121) ^ 0x8000000080000000;
              auVar118._8_4_ = -fVar126;
              auVar118._12_4_ = -fVar127;
              auVar118._16_4_ = -fVar128;
              auVar118._20_4_ = -fVar129;
              auVar118._24_4_ = -fVar130;
              auVar118._28_4_ = 0xb4000000;
              auVar47 = vcmpps_avx(auVar47,auVar118,5);
              auVar111 = ZEXT1632(auVar43);
              auVar62 = vmaxps_avx(local_b60,auVar111);
              auVar48 = vmaxps_avx(auVar62,ZEXT1632(auVar59));
              auVar48 = vcmpps_avx(auVar48,auVar14,2);
              auVar48 = vorps_avx(auVar47,auVar48);
              uVar29 = local_e88;
              k = local_e80;
              uVar33 = local_e90;
              ray = local_e78;
              uVar35 = local_e98;
              uVar36 = local_ea0;
              if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar48 >> 0x7f,0) != '\0') ||
                    (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar48 >> 0xbf,0) != '\0') ||
                  (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar48[0x1f] < '\0') {
                auVar15._4_4_ = fVar141 * local_aa0._4_4_;
                auVar15._0_4_ = fVar138 * local_aa0._0_4_;
                auVar15._8_4_ = fVar143 * local_aa0._8_4_;
                auVar15._12_4_ = fVar145 * local_aa0._12_4_;
                auVar15._16_4_ = fVar146 * local_aa0._16_4_;
                auVar15._20_4_ = fVar147 * local_aa0._20_4_;
                auVar15._24_4_ = fVar148 * local_aa0._24_4_;
                auVar15._28_4_ = auVar47._28_4_;
                auVar16._4_4_ = fVar66 * auVar77._4_4_;
                auVar16._0_4_ = fVar58 * auVar77._0_4_;
                auVar16._8_4_ = fVar68 * auVar77._8_4_;
                auVar16._12_4_ = fVar140 * auVar77._12_4_;
                auVar16._16_4_ = fVar144 * auVar77._16_4_;
                auVar16._20_4_ = fVar151 * auVar77._20_4_;
                auVar16._24_4_ = fVar154 * auVar77._24_4_;
                auVar16._28_4_ = auVar62._28_4_;
                auVar46 = vfmsub213ps_fma(auVar77,local_b00,auVar15);
                auVar17._4_4_ = fVar65 * auVar49._4_4_;
                auVar17._0_4_ = fVar57 * auVar49._0_4_;
                auVar17._8_4_ = fVar67 * auVar49._8_4_;
                auVar17._12_4_ = fVar69 * auVar49._12_4_;
                auVar17._16_4_ = fVar142 * auVar49._16_4_;
                auVar17._20_4_ = fVar150 * auVar49._20_4_;
                auVar17._24_4_ = fVar152 * auVar49._24_4_;
                auVar17._28_4_ = 0x34000000;
                auVar18._4_4_ = fVar66 * auVar63._4_4_;
                auVar18._0_4_ = fVar58 * auVar63._0_4_;
                auVar18._8_4_ = fVar68 * auVar63._8_4_;
                auVar18._12_4_ = fVar140 * auVar63._12_4_;
                auVar18._16_4_ = fVar144 * auVar63._16_4_;
                auVar18._20_4_ = fVar151 * auVar63._20_4_;
                auVar18._24_4_ = fVar154 * auVar63._24_4_;
                auVar18._28_4_ = 0;
                auVar59 = vfmsub213ps_fma(auVar63,local_ae0,auVar17);
                auVar47 = vandps_avx(auVar15,auVar93);
                auVar62 = vandps_avx(auVar17,auVar93);
                auVar47 = vcmpps_avx(auVar47,auVar62,1);
                local_b40 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar46),auVar47);
                auVar19._4_4_ = fVar141 * auVar6._4_4_;
                auVar19._0_4_ = fVar138 * auVar6._0_4_;
                auVar19._8_4_ = fVar143 * auVar6._8_4_;
                auVar19._12_4_ = fVar145 * auVar6._12_4_;
                auVar19._16_4_ = fVar146 * auVar6._16_4_;
                auVar19._20_4_ = fVar147 * auVar6._20_4_;
                auVar19._24_4_ = fVar148 * auVar6._24_4_;
                auVar19._28_4_ = local_b40._28_4_;
                auVar46 = vfmsub213ps_fma(auVar6,local_b00,auVar18);
                auVar20._4_4_ = auVar76._4_4_ * fVar65;
                auVar20._0_4_ = auVar76._0_4_ * fVar57;
                auVar20._8_4_ = auVar76._8_4_ * fVar67;
                auVar20._12_4_ = auVar76._12_4_ * fVar69;
                auVar20._16_4_ = auVar76._16_4_ * fVar142;
                auVar20._20_4_ = auVar76._20_4_ * fVar150;
                auVar20._24_4_ = auVar76._24_4_ * fVar152;
                auVar20._28_4_ = auVar47._28_4_;
                auVar59 = vfmsub213ps_fma(local_aa0,local_b20,auVar20);
                auVar47 = vandps_avx(auVar20,auVar93);
                auVar62 = vandps_avx(auVar18,auVar93);
                auVar47 = vcmpps_avx(auVar47,auVar62,1);
                auVar63 = vblendvps_avx(ZEXT1632(auVar46),ZEXT1632(auVar59),auVar47);
                auVar46 = vfmsub213ps_fma(auVar76,local_ae0,auVar16);
                auVar59 = vfmsub213ps_fma(auVar49,local_b20,auVar19);
                auVar47 = vandps_avx(auVar16,auVar93);
                auVar62 = vandps_avx(auVar19,auVar93);
                auVar47 = vcmpps_avx(auVar47,auVar62,1);
                auVar47 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar46),auVar47);
                auVar46 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
                fVar121 = auVar47._0_4_;
                auVar94._0_4_ = fVar121 * local_ac0;
                fVar57 = auVar47._4_4_;
                auVar94._4_4_ = fVar57 * local_ac0;
                fVar58 = auVar47._8_4_;
                auVar94._8_4_ = fVar58 * local_ac0;
                fVar65 = auVar47._12_4_;
                auVar94._12_4_ = fVar65 * local_ac0;
                fVar66 = auVar47._16_4_;
                auVar94._16_4_ = fVar66 * local_ac0;
                fVar67 = auVar47._20_4_;
                auVar94._20_4_ = fVar67 * local_ac0;
                fVar68 = auVar47._24_4_;
                auVar94._24_4_ = fVar68 * local_ac0;
                auVar94._28_4_ = 0;
                auVar59 = vfmadd213ps_fma(local_e60,auVar63,auVar94);
                auVar59 = vfmadd213ps_fma(local_d80,local_b40,ZEXT1632(auVar59));
                auVar62 = ZEXT1632(CONCAT412(auVar59._12_4_ + auVar59._12_4_,
                                             CONCAT48(auVar59._8_4_ + auVar59._8_4_,
                                                      CONCAT44(auVar59._4_4_ + auVar59._4_4_,
                                                               auVar59._0_4_ + auVar59._0_4_))));
                auVar21._4_4_ = fVar57 * fVar70;
                auVar21._0_4_ = fVar121 * fVar56;
                auVar21._8_4_ = fVar58 * fVar42;
                auVar21._12_4_ = fVar65 * fVar52;
                auVar21._16_4_ = fVar66 * fVar53;
                auVar21._20_4_ = fVar67 * fVar54;
                auVar21._24_4_ = fVar68 * fVar55;
                auVar21._28_4_ = auVar48._28_4_;
                auVar59 = vfmadd213ps_fma(auVar80,auVar63,auVar21);
                auVar60 = vfmadd213ps_fma(local_d60,local_b40,ZEXT1632(auVar59));
                auVar47 = vrcpps_avx(auVar62);
                auVar123._8_4_ = 0x3f800000;
                auVar123._0_8_ = &DAT_3f8000003f800000;
                auVar123._12_4_ = 0x3f800000;
                auVar123._16_4_ = 0x3f800000;
                auVar123._20_4_ = 0x3f800000;
                auVar123._24_4_ = 0x3f800000;
                auVar123._28_4_ = 0x3f800000;
                auVar59 = vfnmadd213ps_fma(auVar47,auVar62,auVar123);
                auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar47,auVar47);
                local_9a0 = ZEXT1632(CONCAT412(auVar59._12_4_ * (auVar60._12_4_ + auVar60._12_4_),
                                               CONCAT48(auVar59._8_4_ *
                                                        (auVar60._8_4_ + auVar60._8_4_),
                                                        CONCAT44(auVar59._4_4_ *
                                                                 (auVar60._4_4_ + auVar60._4_4_),
                                                                 auVar59._0_4_ *
                                                                 (auVar60._0_4_ + auVar60._0_4_)))))
                ;
                uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x60);
                auVar115._4_4_ = uVar39;
                auVar115._0_4_ = uVar39;
                auVar115._8_4_ = uVar39;
                auVar115._12_4_ = uVar39;
                auVar115._16_4_ = uVar39;
                auVar115._20_4_ = uVar39;
                auVar115._24_4_ = uVar39;
                auVar115._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x100);
                auVar119._4_4_ = uVar39;
                auVar119._0_4_ = uVar39;
                auVar119._8_4_ = uVar39;
                auVar119._12_4_ = uVar39;
                auVar119._16_4_ = uVar39;
                auVar119._20_4_ = uVar39;
                auVar119._24_4_ = uVar39;
                auVar119._28_4_ = uVar39;
                auVar47 = vcmpps_avx(auVar115,local_9a0,2);
                auVar48 = vcmpps_avx(local_9a0,auVar119,2);
                auVar47 = vandps_avx(auVar48,auVar47);
                auVar59 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
                auVar46 = vpand_avx(auVar59,auVar46);
                auVar47 = vpmovsxwd_avx2(auVar46);
                if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar47 >> 0x7f,0) != '\0') ||
                      (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar47 >> 0xbf,0) != '\0') ||
                    (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar47[0x1f] < '\0') {
                  auVar47 = vcmpps_avx(auVar62,_DAT_02020f00,4);
                  auVar59 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
                  auVar46 = vpand_avx(auVar46,auVar59);
                  local_a00 = vpmovsxwd_avx2(auVar46);
                  if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(local_a00 >> 0x7f,0) != '\0') ||
                        (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(local_a00 >> 0xbf,0) != '\0') ||
                      (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      local_a00[0x1f] < '\0') {
                    local_a20 = &local_ea9;
                    auVar47 = vsubps_avx(local_c60,auVar111);
                    auVar47 = vblendvps_avx(local_b60,auVar47,local_b80);
                    auVar48 = vsubps_avx(local_c60,local_b60);
                    auVar48 = vblendvps_avx(auVar111,auVar48,local_b80);
                    local_980._4_4_ = local_b40._4_4_ * (float)local_ba0._4_4_;
                    local_980._0_4_ = local_b40._0_4_ * (float)local_ba0._0_4_;
                    local_980._8_4_ = local_b40._8_4_ * fStack_b98;
                    local_980._12_4_ = local_b40._12_4_ * fStack_b94;
                    local_980._16_4_ = local_b40._16_4_ * fStack_b90;
                    local_980._20_4_ = local_b40._20_4_ * fStack_b8c;
                    local_980._24_4_ = local_b40._24_4_ * fStack_b88;
                    local_980._28_4_ = 0;
                    local_960[0] = (float)local_ba0._0_4_ * auVar63._0_4_;
                    local_960[1] = (float)local_ba0._4_4_ * auVar63._4_4_;
                    local_960[2] = fStack_b98 * auVar63._8_4_;
                    local_960[3] = fStack_b94 * auVar63._12_4_;
                    fStack_950 = fStack_b90 * auVar63._16_4_;
                    fStack_94c = fStack_b8c * auVar63._20_4_;
                    fStack_948 = fStack_b88 * auVar63._24_4_;
                    uStack_944 = auVar63._28_4_;
                    local_940[0] = (float)local_ba0._0_4_ * fVar121;
                    local_940[1] = (float)local_ba0._4_4_ * fVar57;
                    local_940[2] = fStack_b98 * fVar58;
                    local_940[3] = fStack_b94 * fVar65;
                    fStack_930 = fStack_b90 * fVar66;
                    fStack_92c = fStack_b8c * fVar67;
                    fStack_928 = fStack_b88 * fVar68;
                    uStack_924 = auVar63._28_4_;
                    auVar51._0_8_ = (ulong)CONCAT24(uVar1,(uint)uVar1) & 0x7fff00007fff;
                    auVar51._8_4_ = local_e6c;
                    auVar51._12_4_ = local_e6c;
                    auVar51._16_4_ = local_e6c;
                    auVar51._20_4_ = local_e6c;
                    auVar51._24_4_ = local_e6c;
                    auVar51._28_4_ = local_e6c;
                    auVar62 = vpaddd_avx2(auVar51,_DAT_0205d4c0);
                    auVar64._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                    auVar64._8_4_ = local_e70;
                    auVar64._12_4_ = local_e70;
                    auVar64._16_4_ = local_e70;
                    auVar64._20_4_ = local_e70;
                    auVar64._24_4_ = local_e70;
                    auVar64._28_4_ = local_e70;
                    auVar111 = vpaddd_avx2(auVar64,_DAT_0205d4e0);
                    auVar97._0_4_ = (float)(int)(*(ushort *)(local_da0 + 8 + local_da8) - 1);
                    auVar97._4_12_ = auVar43._4_12_;
                    auVar46 = vrcpss_avx(auVar97,auVar97);
                    auVar59 = vfnmadd213ss_fma(auVar97,auVar46,SUB6416(ZEXT464(0x40000000),0));
                    fVar56 = auVar46._0_4_ * auVar59._0_4_;
                    auVar103._0_4_ = (float)(int)(*(ushort *)(local_da0 + 10 + local_da8) - 1);
                    auVar103._4_12_ = auVar43._4_12_;
                    auVar46 = vrcpss_avx(auVar103,auVar103);
                    auVar43 = vfnmadd213ss_fma(auVar103,auVar46,SUB6416(ZEXT464(0x40000000),0));
                    fVar70 = auVar46._0_4_ * auVar43._0_4_;
                    auVar62 = vcvtdq2ps_avx(auVar62);
                    fVar57 = auVar62._28_4_ + auVar47._28_4_;
                    fVar42 = (fVar134 * auVar62._0_4_ + auVar47._0_4_) * fVar56;
                    fVar52 = (fVar135 * auVar62._4_4_ + auVar47._4_4_) * fVar56;
                    local_a80._4_4_ = fVar52;
                    local_a80._0_4_ = fVar42;
                    fVar53 = (fVar136 * auVar62._8_4_ + auVar47._8_4_) * fVar56;
                    local_a80._8_4_ = fVar53;
                    fVar54 = (fVar137 * auVar62._12_4_ + auVar47._12_4_) * fVar56;
                    local_a80._12_4_ = fVar54;
                    fVar55 = (auVar62._16_4_ * 0.0 + auVar47._16_4_) * fVar56;
                    local_a80._16_4_ = fVar55;
                    fVar121 = (auVar62._20_4_ * 0.0 + auVar47._20_4_) * fVar56;
                    local_a80._20_4_ = fVar121;
                    fVar56 = (auVar62._24_4_ * 0.0 + auVar47._24_4_) * fVar56;
                    local_a80._24_4_ = fVar56;
                    local_a80._28_4_ = fVar57;
                    auVar47 = vcvtdq2ps_avx(auVar111);
                    fVar58 = (fVar134 * auVar47._0_4_ + auVar48._0_4_) * fVar70;
                    fVar65 = (fVar135 * auVar47._4_4_ + auVar48._4_4_) * fVar70;
                    local_a60._4_4_ = fVar65;
                    local_a60._0_4_ = fVar58;
                    fVar66 = (fVar136 * auVar47._8_4_ + auVar48._8_4_) * fVar70;
                    local_a60._8_4_ = fVar66;
                    fVar67 = (fVar137 * auVar47._12_4_ + auVar48._12_4_) * fVar70;
                    local_a60._12_4_ = fVar67;
                    fVar68 = (auVar47._16_4_ * 0.0 + auVar48._16_4_) * fVar70;
                    local_a60._16_4_ = fVar68;
                    fVar69 = (auVar47._20_4_ * 0.0 + auVar48._20_4_) * fVar70;
                    local_a60._20_4_ = fVar69;
                    fVar70 = (auVar47._24_4_ * 0.0 + auVar48._24_4_) * fVar70;
                    local_a60._24_4_ = fVar70;
                    local_a60._28_4_ = auVar47._28_4_ + auVar48._28_4_;
                    pGVar3 = (local_d98->geometries).items[local_e68].ptr;
                    if ((pGVar3->mask & *(uint *)(local_e78 + local_e80 * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006200ec:
                        auVar120 = ZEXT1664(local_cc0);
                        auVar124 = ZEXT1664(local_cd0);
                        auVar132 = ZEXT1664(local_ce0);
                        auVar104 = ZEXT1664(local_e20);
                        auVar112 = ZEXT1664(local_e30);
                        fVar42 = local_e10;
                        fVar55 = fStack_e0c;
                        fVar121 = fStack_e08;
                        fVar57 = fStack_e04;
                        fVar52 = local_cf0;
                        fVar58 = fStack_cec;
                        fVar65 = fStack_ce8;
                        fVar66 = fStack_ce4;
                        fVar53 = local_d00;
                        fVar67 = fStack_cfc;
                        fVar68 = fStack_cf8;
                        fVar69 = fStack_cf4;
                        fVar54 = local_d10;
                        fVar140 = fStack_d0c;
                        fVar142 = fStack_d08;
                        fVar144 = fStack_d04;
                        fVar56 = local_d20;
                        fVar150 = fStack_d1c;
                        fVar151 = fStack_d18;
                        fVar152 = fStack_d14;
                        fVar70 = local_d30;
                        fVar154 = fStack_d2c;
                        fVar125 = fStack_d28;
                        fVar126 = fStack_d24;
                        goto LAB_00620153;
                      }
                      auVar47 = vrcpps_avx(local_c60);
                      auVar95._8_4_ = 0x3f800000;
                      auVar95._0_8_ = &DAT_3f8000003f800000;
                      auVar95._12_4_ = 0x3f800000;
                      auVar95._16_4_ = 0x3f800000;
                      auVar95._20_4_ = 0x3f800000;
                      auVar95._24_4_ = 0x3f800000;
                      auVar95._28_4_ = 0x3f800000;
                      auVar46 = vfnmadd213ps_fma(local_c60,auVar47,auVar95);
                      auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar47,auVar47);
                      auVar79._8_4_ = 0x219392ef;
                      auVar79._0_8_ = 0x219392ef219392ef;
                      auVar79._12_4_ = 0x219392ef;
                      auVar79._16_4_ = 0x219392ef;
                      auVar79._20_4_ = 0x219392ef;
                      auVar79._24_4_ = 0x219392ef;
                      auVar79._28_4_ = 0x219392ef;
                      auVar47 = vcmpps_avx(local_bc0,auVar79,5);
                      auVar47 = vandps_avx(ZEXT1632(auVar46),auVar47);
                      auVar22._4_4_ = fVar52 * auVar47._4_4_;
                      auVar22._0_4_ = fVar42 * auVar47._0_4_;
                      auVar22._8_4_ = fVar53 * auVar47._8_4_;
                      auVar22._12_4_ = fVar54 * auVar47._12_4_;
                      auVar22._16_4_ = fVar55 * auVar47._16_4_;
                      auVar22._20_4_ = fVar121 * auVar47._20_4_;
                      auVar22._24_4_ = fVar56 * auVar47._24_4_;
                      auVar22._28_4_ = fVar57;
                      local_9e0 = vminps_avx(auVar22,auVar95);
                      auVar23._4_4_ = fVar65 * auVar47._4_4_;
                      auVar23._0_4_ = fVar58 * auVar47._0_4_;
                      auVar23._8_4_ = fVar66 * auVar47._8_4_;
                      auVar23._12_4_ = fVar67 * auVar47._12_4_;
                      auVar23._16_4_ = fVar68 * auVar47._16_4_;
                      auVar23._20_4_ = fVar69 * auVar47._20_4_;
                      auVar23._24_4_ = fVar70 * auVar47._24_4_;
                      auVar23._28_4_ = local_9e0._28_4_;
                      local_9c0 = vminps_avx(auVar23,auVar95);
                      uVar27 = vmovmskps_avx(local_a00);
                      local_c80._1_31_ = auVar80._1_31_;
                      local_c80[0] = uVar27 == 0;
                      if (uVar27 != 0) {
                        lVar28 = 0;
                        uVar32 = (ulong)(uVar27 & 0xff);
                        for (uVar30 = uVar32; (uVar30 & 1) == 0;
                            uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                          lVar28 = lVar28 + 1;
                        }
                        local_c20._0_4_ = local_c20._4_4_;
                        uStack_c18._0_4_ = local_c20._4_4_;
                        uStack_c18._4_4_ = local_c20._4_4_;
                        uStack_c10._0_4_ = local_c20._4_4_;
                        uStack_c10._4_4_ = local_c20._4_4_;
                        uStack_c08._0_4_ = local_c20._4_4_;
                        uStack_c08._4_4_ = local_c20._4_4_;
                        local_c40._0_4_ = local_c40._4_4_;
                        uStack_c38._0_4_ = local_c40._4_4_;
                        uStack_c38._4_4_ = local_c40._4_4_;
                        uStack_c30._0_4_ = local_c40._4_4_;
                        uStack_c30._4_4_ = local_c40._4_4_;
                        uStack_c28._0_4_ = local_c40._4_4_;
                        uStack_c28._4_4_ = local_c40._4_4_;
                        fStack_abc = local_ac0;
                        fStack_ab8 = local_ac0;
                        fStack_ab4 = local_ac0;
                        fStack_ab0 = local_ac0;
                        fStack_aac = local_ac0;
                        fStack_aa8 = local_ac0;
                        fStack_aa4 = local_ac0;
                        local_a40 = local_c60;
                        do {
                          uVar101 = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_8c0 = *(undefined4 *)(local_9e0 + lVar28 * 4);
                          uVar39 = *(undefined4 *)(local_9c0 + lVar28 * 4);
                          local_8a0._4_4_ = uVar39;
                          local_8a0._0_4_ = uVar39;
                          local_8a0._8_4_ = uVar39;
                          local_8a0._12_4_ = uVar39;
                          local_8a0._16_4_ = uVar39;
                          local_8a0._20_4_ = uVar39;
                          local_8a0._24_4_ = uVar39;
                          local_8a0._28_4_ = uVar39;
                          *(undefined4 *)(ray + k * 4 + 0x100) =
                               *(undefined4 *)(local_9a0 + lVar28 * 4);
                          fVar56 = local_960[lVar28 + -8];
                          auVar80._4_4_ = fVar56;
                          auVar80._0_4_ = fVar56;
                          auVar80._8_4_ = fVar56;
                          auVar80._12_4_ = fVar56;
                          auVar80._16_4_ = fVar56;
                          auVar80._20_4_ = fVar56;
                          auVar80._24_4_ = fVar56;
                          auVar80._28_4_ = fVar56;
                          fVar70 = local_960[lVar28];
                          local_900._4_4_ = fVar70;
                          local_900._0_4_ = fVar70;
                          local_900._8_4_ = fVar70;
                          local_900._12_4_ = fVar70;
                          local_900._16_4_ = fVar70;
                          local_900._20_4_ = fVar70;
                          local_900._24_4_ = fVar70;
                          local_900._28_4_ = fVar70;
                          local_d80._0_8_ = lVar28;
                          local_8e0 = local_940[lVar28];
                          local_cb0.context = context->user;
                          local_920[0] = (RTCHitN)SUB41(fVar56,0);
                          local_920[1] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[2] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[3] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[4] = (RTCHitN)SUB41(fVar56,0);
                          local_920[5] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[6] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[7] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[8] = (RTCHitN)SUB41(fVar56,0);
                          local_920[9] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[10] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[0xb] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[0xc] = (RTCHitN)SUB41(fVar56,0);
                          local_920[0xd] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[0xe] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[0xf] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[0x10] = (RTCHitN)SUB41(fVar56,0);
                          local_920[0x11] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[0x12] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[0x13] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[0x14] = (RTCHitN)SUB41(fVar56,0);
                          local_920[0x15] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[0x16] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[0x17] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[0x18] = (RTCHitN)SUB41(fVar56,0);
                          local_920[0x19] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[0x1a] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[0x1b] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          local_920[0x1c] = (RTCHitN)SUB41(fVar56,0);
                          local_920[0x1d] = (RTCHitN)(char)((uint)fVar56 >> 8);
                          local_920[0x1e] = (RTCHitN)(char)((uint)fVar56 >> 0x10);
                          local_920[0x1f] = (RTCHitN)(char)((uint)fVar56 >> 0x18);
                          fStack_8dc = local_8e0;
                          fStack_8d8 = local_8e0;
                          fStack_8d4 = local_8e0;
                          fStack_8d0 = local_8e0;
                          fStack_8cc = local_8e0;
                          fStack_8c8 = local_8e0;
                          fStack_8c4 = local_8e0;
                          uStack_8bc = local_8c0;
                          uStack_8b8 = local_8c0;
                          uStack_8b4 = local_8c0;
                          uStack_8b0 = local_8c0;
                          uStack_8ac = local_8c0;
                          uStack_8a8 = local_8c0;
                          uStack_8a4 = local_8c0;
                          local_880 = local_c40;
                          uStack_878 = uStack_c38;
                          uStack_870 = uStack_c30;
                          uStack_868 = uStack_c28;
                          local_860 = local_c20;
                          uStack_858 = uStack_c18;
                          uStack_850 = uStack_c10;
                          uStack_848 = uStack_c08;
                          auVar47 = vpcmpeqd_avx2(auVar80,auVar80);
                          uStack_83c = (local_cb0.context)->instID[0];
                          local_840 = uStack_83c;
                          uStack_838 = uStack_83c;
                          uStack_834 = uStack_83c;
                          uStack_830 = uStack_83c;
                          uStack_82c = uStack_83c;
                          uStack_828 = uStack_83c;
                          uStack_824 = uStack_83c;
                          uStack_81c = (local_cb0.context)->instPrimID[0];
                          local_820 = uStack_81c;
                          uStack_818 = uStack_81c;
                          uStack_814 = uStack_81c;
                          uStack_810 = uStack_81c;
                          uStack_80c = uStack_81c;
                          uStack_808 = uStack_81c;
                          uStack_804 = uStack_81c;
                          local_c00 = local_be0._0_8_;
                          uStack_bf8 = local_be0._8_8_;
                          uStack_bf0 = local_be0._16_8_;
                          uStack_be8 = local_be0._24_8_;
                          local_cb0.valid = (int *)&local_c00;
                          local_cb0.geometryUserPtr = pGVar3->userPtr;
                          local_cb0.hit = local_920;
                          local_cb0.N = 8;
                          local_cb0.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            local_e60._0_8_ = uVar32;
                            local_d60._0_4_ = uVar101;
                            auVar47 = ZEXT1632(auVar47._0_16_);
                            (*pGVar3->occlusionFilterN)(&local_cb0);
                            auVar47 = vpcmpeqd_avx2(auVar47,auVar47);
                            uVar29 = local_e88;
                            uVar32 = local_e60._0_8_;
                            k = local_e80;
                            uVar33 = local_e90;
                            ray = local_e78;
                            uVar35 = local_e98;
                            uVar36 = local_ea0;
                            uVar101 = local_d60._0_4_;
                          }
                          auVar24._8_8_ = uStack_bf8;
                          auVar24._0_8_ = local_c00;
                          auVar24._16_8_ = uStack_bf0;
                          auVar24._24_8_ = uStack_be8;
                          auVar62 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar24
                                                 );
                          auVar48 = auVar47 & ~auVar62;
                          if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar48 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar48 >> 0x7f,0) == '\0') &&
                                (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar48 >> 0xbf,0) == '\0') &&
                              (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar48[0x1f]) {
                            auVar62 = auVar62 ^ auVar47;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              local_e60._0_8_ = uVar32;
                              local_d60._0_4_ = uVar101;
                              auVar47 = ZEXT1632(auVar47._0_16_);
                              (*p_Var4)(&local_cb0);
                              auVar47 = vpcmpeqd_avx2(auVar47,auVar47);
                              uVar29 = local_e88;
                              uVar32 = local_e60._0_8_;
                              k = local_e80;
                              uVar33 = local_e90;
                              ray = local_e78;
                              uVar35 = local_e98;
                              uVar36 = local_ea0;
                              uVar101 = local_d60._0_4_;
                            }
                            auVar25._8_8_ = uStack_bf8;
                            auVar25._0_8_ = local_c00;
                            auVar25._16_8_ = uStack_bf0;
                            auVar25._24_8_ = uStack_be8;
                            auVar48 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                    auVar25);
                            auVar62 = auVar48 ^ auVar47;
                            auVar81._8_4_ = 0xff800000;
                            auVar81._0_8_ = 0xff800000ff800000;
                            auVar81._12_4_ = 0xff800000;
                            auVar81._16_4_ = 0xff800000;
                            auVar81._20_4_ = 0xff800000;
                            auVar81._24_4_ = 0xff800000;
                            auVar81._28_4_ = 0xff800000;
                            auVar47 = vblendvps_avx(auVar81,*(undefined1 (*) [32])
                                                             (local_cb0.ray + 0x100),auVar48);
                            *(undefined1 (*) [32])(local_cb0.ray + 0x100) = auVar47;
                          }
                          if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar62 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar62 >> 0x7f,0) != '\0') ||
                                (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar62 >> 0xbf,0) != '\0') ||
                              (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar62[0x1f] < '\0') {
                            if ((local_c80 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            goto LAB_006200ec;
                            break;
                          }
                          *(undefined4 *)(ray + k * 4 + 0x100) = uVar101;
                          lVar28 = 0;
                          uVar32 = uVar32 ^ 1L << (local_d80._0_8_ & 0x3f);
                          for (uVar30 = uVar32; (uVar30 & 1) == 0;
                              uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                            lVar28 = lVar28 + 1;
                          }
                          local_c80[0] = uVar32 == 0;
                        } while (uVar32 != 0);
                      }
                    }
                  }
                }
              }
              local_db8 = local_db8 - 1 & local_db8;
              auVar120 = ZEXT1664(local_cc0);
              auVar124 = ZEXT1664(local_cd0);
              auVar132 = ZEXT1664(local_ce0);
              fVar52 = local_cf0;
              fVar58 = fStack_cec;
              fVar65 = fStack_ce8;
              fVar66 = fStack_ce4;
              fVar53 = local_d00;
              fVar67 = fStack_cfc;
              fVar68 = fStack_cf8;
              fVar69 = fStack_cf4;
              fVar54 = local_d10;
              fVar140 = fStack_d0c;
              fVar142 = fStack_d08;
              fVar144 = fStack_d04;
              fVar56 = local_d20;
              fVar150 = fStack_d1c;
              fVar151 = fStack_d18;
              fVar152 = fStack_d14;
              fVar70 = local_d30;
              fVar154 = fStack_d2c;
              fVar125 = fStack_d28;
              fVar126 = fStack_d24;
            } while (local_db8 != 0);
          }
          auVar112 = ZEXT1664(local_e30);
          auVar104 = ZEXT1664(local_e20);
          local_db0 = local_db0 + 1;
          bVar41 = local_db0 < local_df0;
          fVar42 = local_e10;
          fVar55 = fStack_e0c;
          fVar121 = fStack_e08;
          fVar57 = fStack_e04;
        } while (local_db0 != local_df0);
      }
LAB_00620153:
      uVar27 = 0;
      if (bVar41) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar27 = 1;
      }
    }
  } while ((uVar27 & 3) == 0);
  return local_d88 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }